

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestPackage.cpp
# Opt level: O0

int __thiscall deqp::egl::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  EglTestContext *this_00;
  NativeDisplayFactory *displayFactory;
  TestNode *pTVar1;
  TestPackage *this_local;
  
  this_00 = (EglTestContext *)operator_new(0x60);
  testCtx = (this->super_TestPackage).super_TestNode.m_testCtx;
  displayFactory = getDefaultDisplayFactory(testCtx);
  EglTestContext::EglTestContext(this_00,testCtx,displayFactory);
  this->m_eglTestCtx = this_00;
  pTVar1 = (TestNode *)operator_new(0x78);
  InfoTests::InfoTests((InfoTests *)pTVar1,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FunctionalTests::FunctionalTests((FunctionalTests *)pTVar1,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PerformanceTests::PerformanceTests((PerformanceTests *)pTVar1,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  StressTests::StressTests((StressTests *)pTVar1,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	DE_ASSERT(!m_eglTestCtx);
	m_eglTestCtx = new EglTestContext(m_testCtx, getDefaultDisplayFactory(m_testCtx));

	try
	{
		addChild(new InfoTests			(*m_eglTestCtx));
		addChild(new FunctionalTests	(*m_eglTestCtx));
		addChild(new PerformanceTests	(*m_eglTestCtx));
		addChild(new StressTests		(*m_eglTestCtx));
	}
	catch (...)
	{
		delete m_eglTestCtx;
		m_eglTestCtx = DE_NULL;

		throw;
	}
}